

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

int __thiscall
leveldb::MemTable::KeyComparator::operator()(KeyComparator *this,char *aptr,char *bptr)

{
  int iVar1;
  long in_FS_OFFSET;
  Slice b;
  Slice a;
  Slice local_40;
  Slice local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = GetLengthPrefixedSlice(aptr);
  local_40 = GetLengthPrefixedSlice(bptr);
  iVar1 = InternalKeyComparator::Compare(&this->comparator,&local_30,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int MemTable::KeyComparator::operator()(const char* aptr,
                                        const char* bptr) const {
  // Internal keys are encoded as length-prefixed strings.
  Slice a = GetLengthPrefixedSlice(aptr);
  Slice b = GetLengthPrefixedSlice(bptr);
  return comparator.Compare(a, b);
}